

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O0

void __thiscall
RenX_LoggingPlugin::RenX_OnVehicleSpawn
          (RenX_LoggingPlugin *this,Server *server,TeamType *team,string_view vehicle)

{
  bool bVar1;
  TeamType TVar2;
  __sv_type _Var3;
  undefined1 auVar4 [16];
  code *local_210;
  size_t local_178;
  char *local_170;
  size_t local_148;
  char *local_140;
  size_t local_128;
  char *local_120;
  size_t local_108;
  char *local_100;
  size_t local_e8;
  char *local_e0;
  size_t local_c8;
  char *local_c0;
  size_t local_a8;
  char *local_a0;
  size_t local_88;
  char *local_80;
  undefined1 local_60 [4];
  TeamType otherTeam;
  string msg;
  logFuncType func;
  TeamType *team_local;
  Server *server_local;
  RenX_LoggingPlugin *this_local;
  string_view vehicle_local;
  
  if ((*(ulong *)&this->field_0xa0 >> 0x23 & 1) == 0) {
    msg.field_2._8_8_ = RenX::Server::sendAdmChan;
  }
  else {
    msg.field_2._8_8_ = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)local_60,&this->vehicleSpawnFmt);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if (!bVar1) {
    TVar2 = RenX::getEnemy(*team);
    RenX::processTags((string *)local_60,server,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                      (BuildingInfo *)0x0);
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 0x3a8))
    ;
    auVar4 = RenX::getTeamColor(*team);
    local_88 = _Var3._M_len;
    local_80 = _Var3._M_str;
    RenX::replace_tag(local_60,local_88,local_80,auVar4._0_8_,auVar4._8_8_);
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 0x3c8))
    ;
    auVar4 = RenX::getTeamName(*team);
    local_a8 = _Var3._M_len;
    local_a0 = _Var3._M_str;
    RenX::replace_tag(local_60,local_a8,local_a0,auVar4._0_8_,auVar4._8_8_);
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 1000));
    auVar4 = RenX::getFullTeamName(*team);
    local_c8 = _Var3._M_len;
    local_c0 = _Var3._M_str;
    RenX::replace_tag(local_60,local_c8,local_c0,auVar4._0_8_,auVar4._8_8_);
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 0xa08))
    ;
    auVar4 = RenX::getTeamColor(TVar2);
    local_e8 = _Var3._M_len;
    local_e0 = _Var3._M_str;
    RenX::replace_tag(local_60,local_e8,local_e0,auVar4._0_8_,auVar4._8_8_);
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 0xa28))
    ;
    auVar4 = RenX::getTeamName(TVar2);
    local_108 = _Var3._M_len;
    local_100 = _Var3._M_str;
    RenX::replace_tag(local_60,local_108,local_100,auVar4._0_8_,auVar4._8_8_);
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 0xa48))
    ;
    auVar4 = RenX::getFullTeamName(TVar2);
    local_128 = _Var3._M_len;
    local_120 = _Var3._M_str;
    RenX::replace_tag(local_60,local_128,local_120,auVar4._0_8_,auVar4._8_8_);
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 0x328))
    ;
    auVar4 = RenX::translateName(vehicle._M_len,vehicle._M_str);
    local_148 = _Var3._M_len;
    local_140 = _Var3._M_str;
    RenX::replace_tag(local_60,local_148,local_140,auVar4._0_8_,auVar4._8_8_);
    if ((msg.field_2._8_8_ & 1) == 0) {
      local_210 = (code *)msg.field_2._8_8_;
    }
    else {
      local_210 = *(code **)(*(long *)server + msg.field_2._8_8_ + -1);
    }
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    local_178 = _Var3._M_len;
    local_170 = _Var3._M_str;
    (*local_210)(server,local_178,local_170);
  }
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnVehicleSpawn(RenX::Server &server, const RenX::TeamType &team, std::string_view vehicle)
{
	logFuncType func;
	if (RenX_LoggingPlugin::vehicleSpawnPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->vehicleSpawnFmt;
	if (!msg.empty())
	{
		RenX::TeamType otherTeam = RenX::getEnemy(team);
		RenX::processTags(msg, &server);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_COLOR_TAG, RenX::getTeamColor(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_SHORT_TAG, RenX::getTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_LONG_TAG, RenX::getFullTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_COLOR_TAG, RenX::getTeamColor(otherTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_SHORT_TAG, RenX::getTeamName(otherTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_LONG_TAG, RenX::getFullTeamName(otherTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VEHICLE_TAG, RenX::translateName(vehicle));
		(server.*func)(msg);
	}
}